

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::RenameASTIdentifiers::operator()(RenameASTIdentifiers *this,CompoundStmt *node)

{
  bool bVar1;
  shared_ptr<mocker::ast::ASTNode> local_48;
  reference local_38;
  shared_ptr<mocker::ast::Statement> *stmt;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  *__range2;
  CompoundStmt *node_local;
  RenameASTIdentifiers *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
           ::begin(&node->stmts);
  stmt = (shared_ptr<mocker::ast::Statement> *)
         std::
         vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
         ::end(&node->stmts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<mocker::ast::Statement>_*,_std::vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>_>
                                *)&stmt);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<mocker::ast::Statement>_*,_std::vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>_>
               ::operator*(&__end2);
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
              (&local_48,local_38);
    visit(this,&local_48);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_48);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::Statement>_*,_std::vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void operator()(ast::CompoundStmt &node) const override {
    for (auto &stmt : node.stmts)
      visit(stmt);
  }